

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,char *context_string)

{
  ptls_async_job_t **pppVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar2;
  size_t sVar3;
  ptls_buffer_t *buf_00;
  st_ptls_sign_certificate_t *psVar4;
  ptls_iovec_t pVar5;
  int iVar6;
  ptls_async_job_t **pppVar7;
  ulong uVar8;
  long lVar9;
  ptls_async_job_t **pppVar10;
  size_t sVar11;
  uint16_t algo;
  undefined1 local_163;
  undefined2 local_162;
  ptls_buffer_t *local_160;
  size_t local_158;
  size_t local_150;
  ptls_key_schedule_t *local_148;
  size_t local_140;
  size_t local_138;
  st_ptls_signature_algorithms_t *local_130;
  uint8_t *local_128;
  size_t sStack_120;
  uint8_t data [226];
  
  if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
    iVar6 = 0;
  }
  else {
    sVar11 = emitter->buf->off;
    iVar6 = (*emitter->begin_message)(emitter);
    if (iVar6 == 0) {
      buf = emitter->buf;
      ppVar2 = tls->key_schedule;
      sVar3 = buf->off;
      local_163 = 0xf;
      local_138 = sVar11;
      local_130 = signature_algorithms;
      iVar6 = ptls_buffer__do_pushv(buf,&local_163,1);
      if (iVar6 == 0) {
        local_148 = ppVar2;
        local_140 = sVar3;
        iVar6 = ptls_buffer__do_pushv(buf,"",3);
        if (iVar6 == 0) {
          local_150 = buf->off;
          buf_00 = emitter->buf;
          sVar11 = buf_00->off;
          local_162 = 0;
          iVar6 = ptls_buffer__do_pushv(buf_00,&local_162,2);
          if (iVar6 == 0) {
            local_160 = buf;
            local_158 = sVar11;
            iVar6 = ptls_buffer__do_pushv(buf_00,"",2);
            if (iVar6 == 0) {
              sVar11 = buf_00->off;
              sStack_120 = build_certificate_verify_signdata(data,tls->key_schedule,context_string);
              psVar4 = tls->ctx->sign_certificate;
              pppVar7 = (ptls_async_job_t **)0x0;
              pppVar1 = &(tls->field_19).server.async_job;
              pppVar10 = pppVar1;
              if ((tls->field_0x1e8 & 1) == 0) {
                pppVar10 = pppVar7;
              }
              if (local_130 != (st_ptls_signature_algorithms_t *)0x0) {
                pppVar7 = (ptls_async_job_t **)local_130->count;
              }
              pVar5.len = sStack_120;
              pVar5.base = data;
              local_128 = data;
              iVar6 = (*psVar4->cb)(psVar4,tls,pppVar10,&algo,buf_00,pVar5,local_130->list,
                                    (size_t)pppVar7);
              if (iVar6 == 0) {
                if (*pppVar1 != (ptls_async_job_t *)0x0) {
                  __assert_fail("tls->server.async_job == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                ,0xc92,
                                "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                               );
                }
                buf_00->base[local_158] = algo._1_1_;
                buf_00->base[local_158 + 1] = (uint8_t)algo;
                uVar8 = buf_00->off - sVar11;
                iVar6 = 0x20c;
                if (uVar8 < 0x10000) {
                  buf_00->base[sVar11 - 2] = (uint8_t)(uVar8 >> 8);
                  buf_00->base[sVar11 - 1] = (uint8_t)uVar8;
                  uVar8 = local_160->off - local_150;
                  if (uVar8 < 0x1000000) {
                    sVar11 = local_150;
                    for (lVar9 = 0x10; lVar9 != -8; lVar9 = lVar9 + -8) {
                      local_160->base[sVar11 - 3] = (uint8_t)(uVar8 >> ((byte)lVar9 & 0x3f));
                      sVar11 = sVar11 + 1;
                    }
                    if (local_148 != (ptls_key_schedule_t *)0x0) {
                      ptls__key_schedule_update_hash
                                (local_148,local_160->base + local_140,local_160->off - local_140,0)
                      ;
                    }
                    iVar6 = (*emitter->commit_message)(emitter);
                  }
                }
              }
              else if (iVar6 == 0x20b) {
                if ((tls->field_0x1e8 & 1) == 0) {
                  __assert_fail("tls->is_server || !\"async operation only supported on the server-side\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                ,0xc88,
                                "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                               );
                }
                if (*pppVar1 == (ptls_async_job_t *)0x0) {
                  __assert_fail("tls->server.async_job != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                ,0xc89,
                                "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                               );
                }
                emitter->buf->off = local_138;
              }
              else if (*pppVar1 != (ptls_async_job_t *)0x0) {
                __assert_fail("tls->server.async_job == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                              ,0xc8e,
                              "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                             );
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int send_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms, const char *context_string)
{
    size_t start_off = emitter->buf->off;
    int ret;

    if (tls->ctx->sign_certificate == NULL)
        return 0;
    /* build and send CertificateVerify */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
        ptls_buffer_t *sendbuf = emitter->buf;
        size_t algo_off = sendbuf->off;
        ptls_buffer_push16(sendbuf, 0); /* filled in later */
        ptls_buffer_push_block(sendbuf, 2, {
            uint16_t algo;
            uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
            if ((ret = tls->ctx->sign_certificate->cb(
                     tls->ctx->sign_certificate, tls, tls->is_server ? &tls->server.async_job : NULL, &algo, sendbuf,
                     ptls_iovec_init(data, datalen), signature_algorithms != NULL ? signature_algorithms->list : NULL,
                     signature_algorithms != NULL ? signature_algorithms->count : 0)) != 0) {
                if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                    assert(tls->is_server || !"async operation only supported on the server-side");
                    assert(tls->server.async_job != NULL);
                    /* Reset the output to the end of the previous handshake message. CertificateVerify will be rebuilt when the
                     * async operation completes. */
                    emitter->buf->off = start_off;
                } else {
                    assert(tls->server.async_job == NULL);
                }
                goto Exit;
            }
            assert(tls->server.async_job == NULL);
            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
            sendbuf->base[algo_off + 1] = (uint8_t)algo;
        });
    });
Exit:
    return ret;
}